

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int gzwrite(gzFile file,voidpc buf,uint len)

{
  int iVar1;
  long *plVar2;
  z_streamp_conflict strm;
  gz_statep state;
  uint n;
  uint put;
  uint len_local;
  voidpc buf_local;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = 0;
  }
  else {
    plVar2 = (long *)((long)file + 0x78);
    if ((*file == 0x79b1) && (*(int *)((long)file + 0x6c) == 0)) {
      if ((int)len < 0) {
        gz_error((gz_statep)file,-5,"requested length does not fit in int");
        file_local._4_4_ = 0;
      }
      else if (len == 0) {
        file_local._4_4_ = 0;
      }
      else if ((*(int *)((long)file + 0x18) == 0) && (iVar1 = gz_init((gz_statep)file), iVar1 == -1)
              ) {
        file_local._4_4_ = 0;
      }
      else {
        if (*(int *)((long)file + 0x68) != 0) {
          *(undefined4 *)((long)file + 0x68) = 0;
          iVar1 = gz_zero((gz_statep)file,*(long *)((long)file + 0x60));
          if (iVar1 == -1) {
            return 0;
          }
        }
        n = len;
        _put = buf;
        file_local._4_4_ = len;
        if (len < *(uint *)((long)file + 0x18)) {
          do {
            if (*(int *)((long)file + 0x80) == 0) {
              *plVar2 = *(long *)((long)file + 0x20);
            }
            state._4_4_ = *(int *)((long)file + 0x18) - *(int *)((long)file + 0x80);
            if (n < state._4_4_) {
              state._4_4_ = n;
            }
            memcpy((void *)(*plVar2 + (ulong)*(uint *)((long)file + 0x80)),_put,(ulong)state._4_4_);
            *(uint *)((long)file + 0x80) = state._4_4_ + *(int *)((long)file + 0x80);
            *(ulong *)((long)file + 0x10) = (ulong)state._4_4_ + *(long *)((long)file + 0x10);
            _put = (voidpc)((long)_put + (ulong)state._4_4_);
            n = n - state._4_4_;
            if ((n != 0) && (iVar1 = gz_comp((gz_statep)file,0), iVar1 == -1)) {
              return 0;
            }
          } while (n != 0);
        }
        else if ((*(int *)((long)file + 0x80) == 0) ||
                (iVar1 = gz_comp((gz_statep)file,0), iVar1 != -1)) {
          *(uint *)((long)file + 0x80) = len;
          *plVar2 = (long)buf;
          *(ulong *)((long)file + 0x10) = (ulong)len + *(long *)((long)file + 0x10);
          iVar1 = gz_comp((gz_statep)file,0);
          if (iVar1 == -1) {
            file_local._4_4_ = 0;
          }
        }
        else {
          file_local._4_4_ = 0;
        }
      }
    }
    else {
      file_local._4_4_ = 0;
    }
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzwrite(gzFile file, voidpc buf, unsigned len)
{
    unsigned put = len;
    unsigned n;
    gz_statep state;
    z_streamp strm;

    /* get internal structure */
    if (file == NULL)
        return 0;
    state = (gz_statep)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return 0;

    /* since an int is returned, make sure len fits in one, otherwise return
       with an error (this avoids the flaw in the interface) */
    if ((int)len < 0) {
        gz_error(state, Z_BUF_ERROR, "requested length does not fit in int");
        return 0;
    }

    /* if len is zero, avoid unnecessary operations */
    if (len == 0)
        return 0;

    /* allocate memory if this is the first time through */
    if (state->size == 0 && gz_init(state) == -1)
        return 0;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return 0;
    }

    /* for small len, copy to input buffer, otherwise compress directly */
    if (len < state->size) {
        /* copy to input buffer, compress when full */
        do {
            if (strm->avail_in == 0)
                strm->next_in = state->in;
            n = state->size - strm->avail_in;
            if (n > len)
                n = len;
            memcpy(strm->next_in + strm->avail_in, buf, n);
            strm->avail_in += n;
            state->pos += n;
            buf = (char *)buf + n;
            len -= n;
            if (len && gz_comp(state, Z_NO_FLUSH) == -1)
                return 0;
        } while (len);
    }
    else {
        /* consume whatever's left in the input buffer */
        if (strm->avail_in && gz_comp(state, Z_NO_FLUSH) == -1)
            return 0;

        /* directly compress user buffer to file */
        strm->avail_in = len;
        strm->next_in = (unsigned char *)(voidp)buf;
        state->pos += len;
        if (gz_comp(state, Z_NO_FLUSH) == -1)
            return 0;
    }

    /* input was all buffered or compressed (put will fit in int) */
    return (int)put;
}